

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  ImGui_ImplGlfw_Data *pIVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  GLFWwindow *in_RDI;
  ImGuiIO *io;
  ImGui_ImplGlfw_Data *bd;
  undefined4 in_stack_00000010;
  
  pIVar1 = ImGui_ImplGlfw_GetBackendData();
  if ((pIVar1->PrevUserCallbackMousebutton != (GLFWmousebuttonfun)0x0) && (in_RDI == pIVar1->Window)
     ) {
    (*pIVar1->PrevUserCallbackMousebutton)(in_RDI,in_ESI,in_EDX,in_ECX);
  }
  ImGui_ImplGlfw_UpdateKeyModifiers((int)((ulong)pIVar1 >> 0x20));
  ImGui::GetIO();
  if ((-1 < in_ESI) && (in_ESI < 5)) {
    ImGuiIO::AddMouseButtonEvent((ImGuiIO *)CONCAT44(mods,in_stack_00000010),bd._4_4_,bd._3_1_);
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_MouseButtonCallback(GLFWwindow* window, int button, int action, int mods)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackMousebutton != nullptr && window == bd->Window)
        bd->PrevUserCallbackMousebutton(window, button, action, mods);

    ImGui_ImplGlfw_UpdateKeyModifiers(mods);

    ImGuiIO& io = ImGui::GetIO();
    if (button >= 0 && button < ImGuiMouseButton_COUNT)
        io.AddMouseButtonEvent(button, action == GLFW_PRESS);
}